

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

bool __thiscall
World::CreatePlayer(World *this,string *username,secure_string *password,string *fullname,
                   string *location,string *email,string *computer,string *hdid,string *ip)

{
  bool bVar1;
  mapped_type *this_00;
  string *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  time_t tVar11;
  undefined1 local_148 [8];
  Database_Result result;
  allocator<char> local_f1;
  key_type local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  secure_string password_buffer;
  string *email_local;
  string *location_local;
  string *fullname_local;
  secure_string *password_local;
  string *username_local;
  World *this_local;
  
  password_buffer.str_.field_2._8_8_ = email;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"PasswordSalt",&local_f1);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(this->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_f0);
  util::variant::operator_cast_to_string(&local_d0,this_00);
  std::operator+(&local_b0,&local_d0,username);
  psVar2 = util::secure_string::str_abi_cxx11_(password);
  std::operator+(&local_90,&local_b0,psVar2);
  util::secure_string::secure_string((secure_string *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  psVar2 = util::secure_string::str_abi_cxx11_((secure_string *)local_70);
  sha256((string *)&result.affected_rows,psVar2);
  util::secure_string::operator=(password,(string *)&result.affected_rows);
  std::__cxx11::string::~string((string *)&result.affected_rows);
  util::secure_string::~secure_string((secure_string *)local_70);
  uVar3 = std::__cxx11::string::c_str();
  util::secure_string::str_abi_cxx11_(password);
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  uVar6 = std::__cxx11::string::c_str();
  uVar7 = std::__cxx11::string::c_str();
  uVar8 = std::__cxx11::string::c_str();
  uVar9 = std::__cxx11::string::c_str();
  uVar10 = std::__cxx11::string::c_str();
  tVar11 = time((time_t *)0x0);
  Database::Query((Database_Result *)local_148,&this->db,
                  "INSERT INTO `accounts` (`username`, `password`, `fullname`, `location`, `email`, `computer`, `hdid`, `regip`, `created`) VALUES (\'$\',\'$\',\'$\',\'$\',\'$\',\'$\',\'$\',\'$\',#)"
                  ,uVar3,uVar4,uVar5,uVar6,uVar7,uVar8,uVar9,uVar10,(int)tVar11);
  bVar1 = Database_Result::Error((Database_Result *)local_148);
  Database_Result::~Database_Result((Database_Result *)local_148);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool World::CreatePlayer(const std::string& username, util::secure_string&& password,
	const std::string& fullname, const std::string& location, const std::string& email,
	const std::string& computer, const std::string& hdid, const std::string& ip)
{
	{
		util::secure_string password_buffer(std::move(std::string(this->config["PasswordSalt"]) + username + password.str()));
		password = sha256(password_buffer.str());
	}

	Database_Result result = this->db.Query("INSERT INTO `accounts` (`username`, `password`, `fullname`, `location`, `email`, `computer`, `hdid`, `regip`, `created`) VALUES ('$','$','$','$','$','$','$','$',#)",
		username.c_str(), password.str().c_str(), fullname.c_str(), location.c_str(), email.c_str(), computer.c_str(), hdid.c_str(), ip.c_str(), int(std::time(0)));

	return !result.Error();
}